

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ri_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_40 [8];
  CBS renegotiated_connection;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  renegotiated_connection.len = (size_t)hs->ssl;
  if ((((byte)(*(ushort *)&((SSL *)renegotiated_connection.len)->s3->field_0xdc >> 4) & 1 ^ 0xff) &
      1) == 0) {
    __assert_fail("!ssl->s3->initial_handshake_complete",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x30f,"bool bssl::ext_ri_parse_clienthello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
  }
  uVar1 = ssl_protocol_version((SSL *)renegotiated_connection.len);
  if (uVar1 < 0x304) {
    if (contents == (CBS *)0x0) {
      hs_local._7_1_ = true;
    }
    else {
      iVar2 = CBS_get_u8_length_prefixed(contents,(CBS *)local_40);
      if ((iVar2 != 0) && (sVar3 = CBS_len(contents), sVar3 == 0)) {
        sVar3 = CBS_len((CBS *)local_40);
        if (sVar3 != 0) {
          ERR_put_error(0x10,0,0xca,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x323);
          *out_alert = '(';
          return false;
        }
        *(ushort *)(*(long *)(renegotiated_connection.len + 0x30) + 0xdc) =
             *(ushort *)(*(long *)(renegotiated_connection.len + 0x30) + 0xdc) & 0xffbf | 0x40;
        return true;
      }
      ERR_put_error(0x10,0,0xc9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x31c);
      hs_local._7_1_ = false;
    }
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ri_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                     CBS *contents) {
  SSL *const ssl = hs->ssl;
  // Renegotiation isn't supported as a server so this function should never be
  // called after the initial handshake.
  assert(!ssl->s3->initial_handshake_complete);

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents == NULL) {
    return true;
  }

  CBS renegotiated_connection;
  if (!CBS_get_u8_length_prefixed(contents, &renegotiated_connection) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_ENCODING_ERR);
    return false;
  }

  // Check that the extension matches. We do not support renegotiation as a
  // server, so this must be empty.
  if (CBS_len(&renegotiated_connection) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  ssl->s3->send_connection_binding = true;

  return true;
}